

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3e503::CleanTestCleanRuleGenerator::Run(CleanTestCleanRuleGenerator *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *pTVar1;
  int iVar2;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  Cleaner cleaner;
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule regen\n  command = cat $in > $out\n  generator = 1\nbuild out1: cat in1\nbuild out2: regen in2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleaner,"out1",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_10a);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&cleaner,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&cleaner);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleaner,"out2",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_10a);
    VirtualFileSystem::Create(this_00,(string *)&cleaner,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&cleaner);
    Cleaner::Cleaner(&cleaner,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface);
    pTVar1 = g_current_test;
    iVar2 = Cleaner::CleanAll(&cleaner,false);
    testing::Test::Check
              (pTVar1,iVar2 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf3,"0 == cleaner.CleanAll()");
    testing::Test::Check
              (g_current_test,cleaner.cleaned_files_count_ == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf4,"1 == cleaner.cleaned_files_count()");
    testing::Test::Check
              (g_current_test,
               (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf5,"1u == fs_.files_removed_.size()");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"out1",&local_10a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_109);
    VirtualFileSystem::Create(this_00,&local_108,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    pTVar1 = g_current_test;
    iVar2 = Cleaner::CleanAll(&cleaner,true);
    testing::Test::Check
              (pTVar1,iVar2 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf9,"0 == cleaner.CleanAll( true)");
    testing::Test::Check
              (g_current_test,cleaner.cleaned_files_count_ == 2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xfa,"2 == cleaner.cleaned_files_count()");
    testing::Test::Check
              (g_current_test,
               (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count == 2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xfb,"2u == fs_.files_removed_.size()");
    Cleaner::~Cleaner(&cleaner);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanRuleGenerator) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule regen\n"
"  command = cat $in > $out\n"
"  generator = 1\n"
"build out1: cat in1\n"
"build out2: regen in2\n"));
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(1, cleaner.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());

  fs_.Create("out1", "");

  EXPECT_EQ(0, cleaner.CleanAll(/*generator=*/true));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}